

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>::operator()
          (void *this,char *value_text,array<unsigned_long,_5UL> *x)

{
  ostream **this_00;
  bool bVar1;
  size_t sVar2;
  AssertionResult *other;
  array<unsigned_long,_5UL> *in_RCX;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  undefined1 local_398 [8];
  StringMatchResultListener listener;
  stringstream ss;
  long local_1f0 [14];
  ios_base local_180 [264];
  undefined1 local_78 [8];
  Matcher<const_std::array<unsigned_long,_5UL>_&> matcher;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  undefined1 local_40 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  ElementsAreArrayMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::array<unsigned_long,_5UL>_&> *)local_78,
             (ElementsAreArrayMatcher *)value_text);
  listener.super_MatchResultListener._vptr_MatchResultListener = (_func_int **)0x0;
  local_398 = (undefined1  [8])&PTR__MatchResultListener_001d6a30;
  bVar1 = MatcherBase<const_std::array<unsigned_long,_5UL>_&>::MatchAndExplain
                    ((MatcherBase<const_std::array<unsigned_long,_5UL>_&> *)local_78,in_RCX,
                     (MatchResultListener *)local_398);
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&listener.field_0x190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"Value of: ",10);
    if (x == (array<unsigned_long,_5UL> *)0x0) {
      std::ios::clear((int)(ostream *)local_1f0 + (int)*(undefined8 *)(local_1f0[0] + -0x18));
    }
    else {
      sVar2 = strlen((char *)x);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,(char *)x,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"Expected: ",10);
    MatcherBase<const_std::array<unsigned_long,_5UL>_&>::DescribeTo
              ((MatcherBase<const_std::array<unsigned_long,_5UL>_&> *)local_78,(ostream *)local_1f0)
    ;
    this_00 = &listener.super_MatchResultListener.stream_;
    listener.super_MatchResultListener._vptr_MatchResultListener =
         (_func_int **)&listener.field_0x18;
    local_398 = (undefined1  [8])&PTR__StringMatchResultListener_001d6b58;
    std::__cxx11::stringstream::stringstream((stringstream *)this_00);
    bVar1 = MatchPrintAndExplain<std::array<unsigned_long,5ul>const,std::array<unsigned_long,5ul>const&>
                      (in_RCX,(Matcher<const_std::array<unsigned_long,_5UL>_&> *)local_78,
                       (MatchResultListener *)local_398);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1f0,
                 "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                 ,0x60);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1f0,"\n  Actual: ",0xb);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1f0,
               (char *)matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_.ptr
               ,local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_.ptr !=
        &local_50) {
      operator_delete(matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_.ptr,
                      local_50._M_allocated_capacity + 1);
    }
    AssertionFailure();
    std::__cxx11::stringbuf::str();
    other = AssertionResult::operator<<
                      ((AssertionResult *)local_40,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_);
    AssertionResult::AssertionResult((AssertionResult *)this,other);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_.ptr !=
        &local_50) {
      operator_delete(matcher.super_MatcherBase<const_std::array<unsigned_long,_5UL>_&>.buffer_.ptr,
                      local_50._M_allocated_capacity + 1);
    }
    if (local_38._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_38._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    }
    local_398 = (undefined1  [8])&PTR__StringMatchResultListener_001d6b58;
    std::__cxx11::stringstream::~stringstream((stringstream *)this_00);
    std::ios_base::~ios_base((ios_base *)&listener.field_0x88);
    std::__cxx11::stringstream::~stringstream((stringstream *)&listener.field_0x190);
    std::ios_base::~ios_base(local_180);
  }
  MatcherBase<const_std::array<unsigned_long,_5UL>_&>::~MatcherBase
            ((MatcherBase<const_std::array<unsigned_long,_5UL>_&> *)local_78);
  AVar3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult operator()(const char* value_text, const T& x) const {
    // We convert matcher_ to a Matcher<const T&> *now* instead of
    // when the PredicateFormatterFromMatcher object was constructed,
    // as matcher_ may be polymorphic (e.g. NotNull()) and we won't
    // know which type to instantiate it to until we actually see the
    // type of x here.
    //
    // We write SafeMatcherCast<const T&>(matcher_) instead of
    // Matcher<const T&>(matcher_), as the latter won't compile when
    // matcher_ has type Matcher<T> (e.g. An<int>()).
    // We don't write MatcherCast<const T&> either, as that allows
    // potentially unsafe downcasting of the matcher argument.
    const Matcher<const T&> matcher = SafeMatcherCast<const T&>(matcher_);

    // The expected path here is that the matcher should match (i.e. that most
    // tests pass) so optimize for this case.
    if (matcher.Matches(x)) {
      return AssertionSuccess();
    }

    ::std::stringstream ss;
    ss << "Value of: " << value_text << "\n"
       << "Expected: ";
    matcher.DescribeTo(&ss);

    // Rerun the matcher to "PrintAndExplain" the failure.
    StringMatchResultListener listener;
    if (MatchPrintAndExplain(x, matcher, &listener)) {
      ss << "\n  The matcher failed on the initial attempt; but passed when "
            "rerun to generate the explanation.";
    }
    ss << "\n  Actual: " << listener.str();
    return AssertionFailure() << ss.str();
  }